

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::reserve
          (vector<crnlib::vector<unsigned_int>_> *this,uint new_capacity)

{
  uint in_ESI;
  long in_RDI;
  vector<crnlib::vector<unsigned_int>_> tmp;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  undefined1 in_stack_ffffffffffffffbb;
  uint in_stack_ffffffffffffffbc;
  vector<crnlib::vector<unsigned_int>_> *in_stack_ffffffffffffffc0;
  vector<crnlib::vector<unsigned_int>_> *this_00;
  vector<crnlib::vector<unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<crnlib::vector<unsigned_int>_> *in_stack_ffffffffffffffd8;
  vector<crnlib::vector<unsigned_int>_> local_20;
  uint local_c;
  
  if (*(uint *)(in_RDI + 0xc) < in_ESI) {
    increase_capacity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                      (bool)in_stack_ffffffffffffffbb,(bool)in_stack_ffffffffffffffba);
  }
  else if (in_ESI < *(uint *)(in_RDI + 0xc)) {
    this_00 = &local_20;
    local_c = in_ESI;
    vector(this_00);
    math::maximum<unsigned_int>(*(uint *)(in_RDI + 8),local_c);
    increase_capacity(this_00,in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb,
                      (bool)in_stack_ffffffffffffffba);
    operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    swap(this_00,(vector<crnlib::vector<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffffbc,
                          CONCAT13(in_stack_ffffffffffffffbb,
                                   CONCAT12(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))));
    ~vector(this_00);
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }